

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

CPubKey * __thiscall
wallet::LegacyScriptPubKeyMan::GenerateNewSeed
          (CPubKey *__return_storage_ptr__,LegacyScriptPubKeyMan *this)

{
  WalletStorage *pWVar1;
  int iVar2;
  long in_FS_OFFSET;
  undefined1 local_30 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
  iVar2 = (*pWVar1->_vptr_WalletStorage[4])(pWVar1,0x100000000);
  if ((char)iVar2 != '\0') {
    __assert_fail("!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x4bc,"CPubKey wallet::LegacyScriptPubKeyMan::GenerateNewSeed()");
  }
  GenerateRandomKey(SUB81((CKey *)local_30,0));
  DeriveNewSeed(__return_storage_ptr__,this,(CKey *)local_30);
  if ((_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)local_28._M_head_impl !=
      (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_28,
               local_28._M_head_impl);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CPubKey LegacyScriptPubKeyMan::GenerateNewSeed()
{
    assert(!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS));
    CKey key = GenerateRandomKey();
    return DeriveNewSeed(key);
}